

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O1

qpdf_offset_t __thiscall
QPDFWriter::writeXRefStream
          (QPDFWriter *this,int xref_id,int max_id,qpdf_offset_t max_offset,trailer_e which,
          int first,int last,int size,qpdf_offset_t prev,int hint_id,qpdf_offset_t hint_offset,
          qpdf_offset_t hint_length,bool skip_compression,int linearization_pass)

{
  element_type *peVar1;
  string *psVar2;
  size_type sVar3;
  bool bVar4;
  _Head_base<0UL,_qpdf::pl::Link_*,_false> __ptr;
  _Head_base<0UL,_qpdf::pl::Link_*,_false> _Var5;
  char cVar6;
  int iVar7;
  size_type *psVar8;
  NewObject *pNVar9;
  qpdf_offset_t qVar10;
  long *plVar11;
  undefined8 *puVar12;
  logic_error *this_00;
  uint uVar13;
  uint uVar14;
  uint *args_1;
  void *pvVar15;
  QPDFWriter *pQVar16;
  Link *pLVar17;
  long *plVar18;
  size_t __n;
  ulong uVar19;
  uint uVar20;
  char cVar21;
  uint uVar22;
  uint *idx;
  unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_> uVar23;
  Link *pLVar24;
  type ii;
  int iVar25;
  long lVar26;
  type ii_1;
  uint uVar27;
  long lVar28;
  unsigned_long_long val;
  string __str_1;
  string __str_3;
  uint esize;
  string __str_2;
  string xref_data;
  _Head_base<0UL,_qpdf::pl::Link_*,_false> local_168;
  long local_160;
  Link local_158;
  PipelinePopper local_148;
  QPDFWriter local_138;
  _Head_base<0UL,_qpdf::pl::Link_*,_false> local_128;
  long local_120;
  Link local_118;
  Link **local_108;
  uint local_100;
  undefined4 uStack_fc;
  Link *local_f8 [2];
  ulong local_e8;
  uint local_dc;
  long *local_d8;
  long local_d0;
  long local_c8;
  long lStack_c0;
  ulong local_b8;
  long *local_b0;
  uint local_a8;
  long local_a0 [2];
  unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_> local_90;
  trailer_e local_84;
  uint local_80;
  int local_7c;
  ulong local_78;
  __uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_> local_70;
  _Head_base<0UL,_qpdf::pl::Link_*,_false> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  size_type local_40;
  ulong local_38;
  
  peVar1 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  psVar2 = peVar1->pipeline->str;
  psVar8 = (size_type *)&peVar1->pipeline->count;
  if (psVar2 != (string *)0x0) {
    psVar8 = &psVar2->_M_string_length;
  }
  uVar20 = 0;
  uVar22 = 0;
  if (max_offset + hint_length != 0) {
    uVar22 = 0;
    uVar19 = max_offset + hint_length;
    do {
      uVar22 = uVar22 + 1;
      bVar4 = 0xff < uVar19;
      uVar19 = (long)uVar19 >> 8;
    } while (bVar4);
  }
  if (max_id != 0) {
    uVar20 = 0;
    do {
      uVar20 = uVar20 + 1;
      bVar4 = 0xff < (uint)max_id;
      max_id = max_id >> 8;
    } while (bVar4);
  }
  if (uVar20 < uVar22) {
    uVar20 = uVar22;
  }
  local_40 = *psVar8;
  if ((long)peVar1->max_ostream_index < 0) {
    QIntC::IntConverter<unsigned_long,_long_long,_false,_true>::error(peVar1->max_ostream_index);
  }
  uVar19 = peVar1->max_ostream_index;
  local_e8 = 0;
  if (uVar19 != 0) {
    do {
      local_e8 = (ulong)((int)local_e8 + 1);
      bVar4 = 0xff < uVar19;
      uVar19 = (long)uVar19 >> 8;
    } while (bVar4);
  }
  local_dc = (int)local_e8 + uVar20 + 1;
  peVar1 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  lVar26 = *(long *)&(peVar1->new_obj).super_ObjTable<QPDFWriter::NewObject>.
                     super_vector<QPDFWriter::NewObject,_std::allocator<QPDFWriter::NewObject>_>.
                     super__Vector_base<QPDFWriter::NewObject,_std::allocator<QPDFWriter::NewObject>_>
                     ._M_impl;
  psVar2 = peVar1->pipeline->str;
  psVar8 = (size_type *)&peVar1->pipeline->count;
  if (psVar2 != (string *)0x0) {
    psVar8 = &psVar2->_M_string_length;
  }
  sVar3 = *psVar8;
  idx = (uint *)(long)xref_id;
  args_1 = (uint *)((long)*(pointer *)
                           ((long)&(peVar1->new_obj).super_ObjTable<QPDFWriter::NewObject>.
                                   super_vector<QPDFWriter::NewObject,_std::allocator<QPDFWriter::NewObject>_>
                                   .
                                   super__Vector_base<QPDFWriter::NewObject,_std::allocator<QPDFWriter::NewObject>_>
                           + 8) - lVar26 >> 5);
  if (idx < args_1) {
    pNVar9 = (NewObject *)(lVar26 + (long)idx * 0x20);
  }
  else {
    pNVar9 = ObjTable<QPDFWriter::NewObject>::large_element
                       (&(peVar1->new_obj).super_ObjTable<QPDFWriter::NewObject>,(size_t)idx);
  }
  (pNVar9->xref).type = 1;
  (pNVar9->xref).field1 = sVar3;
  (pNVar9->xref).field2 = 0;
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  local_60._M_string_length = 0;
  local_60.field_2._M_local_buf[0] = '\0';
  peVar1 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1->compress_streams == true) {
    local_80 = (uint)CONCAT71((int7)(sVar3 >> 8),peVar1->qdf_mode) ^ 1;
  }
  else {
    local_80 = 0;
  }
  local_148.stack_id = 0;
  local_148.qw = this;
  local_84 = which;
  local_7c = xref_id;
  if ((char)local_80 == '\0') {
    activatePipelineStack(this,&local_148,&local_60);
  }
  else {
    (peVar1->count_buffer)._M_string_length = 0;
    *(peVar1->count_buffer)._M_dataplus._M_p = '\0';
    ::qpdf::pl::create<qpdf::pl::String,std::__cxx11::string&>((pl *)&local_168,&local_60);
    if (!skip_compression) {
      local_68._M_head_impl = local_168._M_head_impl;
      local_168._M_head_impl = (Link *)0x0;
      local_d8 = (long *)CONCAT44(local_d8._4_4_,1);
      ::qpdf::pl::create<Pl_Flate,Pl_Flate::action_e>
                ((pl *)&local_128,
                 (unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_> *)&local_68,
                 (action_e *)&local_d8);
      _Var5._M_head_impl = local_128._M_head_impl;
      __ptr._M_head_impl = local_168._M_head_impl;
      local_128._M_head_impl = (Link *)0x0;
      local_168._M_head_impl = _Var5._M_head_impl;
      if (__ptr._M_head_impl != (Link *)0x0) {
        std::default_delete<qpdf::pl::Link>::operator()
                  ((default_delete<qpdf::pl::Link> *)&local_168,__ptr._M_head_impl);
      }
      std::unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>::~unique_ptr
                ((unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_> *)&local_128);
      std::unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>::~unique_ptr
                ((unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_> *)&local_68);
    }
    local_70._M_t.super__Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>.
    super__Head_base<0UL,_qpdf::pl::Link_*,_false>._M_head_impl =
         (tuple<qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>)
         (tuple<qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>)local_168._M_head_impl;
    local_168._M_head_impl = (Link *)0x0;
    local_128._M_head_impl = local_128._M_head_impl & 0xffffffff00000000;
    args_1 = &local_dc;
    ::qpdf::pl::create<Pl_PNGFilter,Pl_PNGFilter::action_e,unsigned_int&>
              ((pl *)&local_90,
               (unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_> *)&local_70,
               (action_e *)&local_128,args_1);
    activatePipelineStack(this,&local_148,&local_90);
    std::unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>::~unique_ptr(&local_90);
    std::unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>::~unique_ptr
              ((unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_> *)&local_70);
    std::unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>::~unique_ptr
              ((unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_> *)&local_168);
  }
  local_78 = (ulong)(uint)(last - first);
  local_b8 = (ulong)(uint)first;
  if (first <= last) {
    uVar19 = (ulong)first;
    local_38 = (ulong)hint_id;
    lVar26 = uVar19 << 5;
    iVar25 = (last - first) + 1;
    do {
      peVar1 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      lVar28 = *(long *)&(peVar1->new_obj).super_ObjTable<QPDFWriter::NewObject>.
                         super_vector<QPDFWriter::NewObject,_std::allocator<QPDFWriter::NewObject>_>
                         .
                         super__Vector_base<QPDFWriter::NewObject,_std::allocator<QPDFWriter::NewObject>_>
                         ._M_impl;
      if (uVar19 < (ulong)((long)*(pointer *)
                                  ((long)&(peVar1->new_obj).super_ObjTable<QPDFWriter::NewObject>.
                                          super_vector<QPDFWriter::NewObject,_std::allocator<QPDFWriter::NewObject>_>
                                          .
                                          super__Vector_base<QPDFWriter::NewObject,_std::allocator<QPDFWriter::NewObject>_>
                                  + 8) - lVar28 >> 5)) {
        pNVar9 = (NewObject *)(lVar28 + lVar26);
      }
      else {
        pNVar9 = ObjTable<QPDFWriter::NewObject>::large_element
                           (&(peVar1->new_obj).super_ObjTable<QPDFWriter::NewObject>,uVar19);
      }
      iVar7 = QPDFXRefEntry::getType(&pNVar9->xref);
      if (iVar7 == 0) {
        writeBinary(this,0,1);
        writeBinary(this,0,uVar20);
        writeBinary(this,0,(uint)local_e8);
      }
      else if (iVar7 == 1) {
        qVar10 = QPDFXRefEntry::getOffset(&pNVar9->xref);
        lVar28 = 0;
        if (hint_offset <= qVar10) {
          lVar28 = hint_length;
        }
        args_1 = (uint *)0x0;
        if (local_38 == uVar19) {
          lVar28 = 0;
        }
        if ((int)local_38 == 0) {
          lVar28 = 0;
        }
        writeBinary(this,1,1);
        val = lVar28 + qVar10;
        if ((long)val < 0) {
          QIntC::IntConverter<long_long,_unsigned_long_long,_true,_false>::error(val);
        }
        writeBinary(this,val,uVar20);
        writeBinary(this,0,(uint)local_e8);
      }
      else {
        if (iVar7 != 2) {
          this_00 = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error(this_00,"invalid type writing xref stream");
          __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
        }
        writeBinary(this,2,1);
        iVar7 = QPDFXRefEntry::getObjStreamNumber(&pNVar9->xref);
        if (iVar7 < 0) {
          QIntC::IntConverter<int,_unsigned_long_long,_true,_false>::error(iVar7);
        }
        writeBinary(this,(long)iVar7,uVar20);
        iVar7 = QPDFXRefEntry::getObjStreamIndex(&pNVar9->xref);
        if (iVar7 < 0) {
          QIntC::IntConverter<int,_unsigned_long_long,_true,_false>::error(iVar7);
        }
        writeBinary(this,(long)iVar7,(uint)local_e8);
      }
      uVar19 = uVar19 + 1;
      lVar26 = lVar26 + 0x20;
      iVar25 = iVar25 + -1;
    } while (iVar25 != 0);
  }
  PipelinePopper::~PipelinePopper(&local_148);
  iVar25 = local_7c;
  openObject(this,local_7c);
  ::qpdf::pl::Count::write
            (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
             ->pipeline,0x27d8fc,(void *)0x2,(size_t)args_1);
  peVar1 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1->qdf_mode == true) {
    ::qpdf::pl::Count::write(peVar1->pipeline,0x27db5d,(void *)0x2,(size_t)args_1);
  }
  ::qpdf::pl::Count::write
            (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
             ->pipeline,0x27dd28,(void *)0xc,(size_t)args_1);
  peVar1 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1->qdf_mode == true) {
    ::qpdf::pl::Count::write(peVar1->pipeline,0x27db5d,(void *)0x2,(size_t)args_1);
  }
  sVar3 = local_60._M_string_length;
  cVar21 = '\x01';
  if ((void *)0x9 < local_60._M_string_length) {
    pvVar15 = (void *)local_60._M_string_length;
    cVar6 = '\x04';
    do {
      cVar21 = cVar6;
      if (pvVar15 < (void *)0x64) {
        cVar21 = cVar21 + -2;
        goto LAB_001f5b3c;
      }
      if (pvVar15 < (void *)0x3e8) {
        cVar21 = cVar21 + -1;
        goto LAB_001f5b3c;
      }
      if (pvVar15 < (void *)0x2710) goto LAB_001f5b3c;
      bVar4 = (void *)0x1869f < pvVar15;
      pvVar15 = (void *)((ulong)pvVar15 / 10000);
      cVar6 = cVar21 + '\x04';
    } while (bVar4);
    cVar21 = cVar21 + '\x01';
  }
LAB_001f5b3c:
  local_168._M_head_impl = &local_158;
  std::__cxx11::string::_M_construct((ulong)&local_168,cVar21);
  std::__detail::__to_chars_10_impl<unsigned_long>
            ((char *)local_168._M_head_impl,(uint)local_160,sVar3);
  plVar11 = (long *)std::__cxx11::string::replace((ulong)&local_168,0,(char *)0x0,0x27d560);
  pQVar16 = (QPDFWriter *)(plVar11 + 2);
  if ((QPDFWriter *)*plVar11 == pQVar16) {
    local_138.m.super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (pQVar16->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_138.m.super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar11[3];
    local_148.qw = &local_138;
  }
  else {
    local_138.m.super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (pQVar16->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_148.qw = (QPDFWriter *)*plVar11;
  }
  local_148.stack_id = plVar11[1];
  *plVar11 = (long)pQVar16;
  plVar11[1] = 0;
  *(undefined1 *)(plVar11 + 2) = 0;
  ::qpdf::pl::Count::write
            (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
             ->pipeline,(int)local_148.qw,(void *)local_148.stack_id,(size_t)pQVar16);
  if (local_148.qw != &local_138) {
    operator_delete(local_148.qw,
                    (ulong)((long)&(local_138.m.
                                    super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->pdf + 1));
  }
  uVar22 = local_80;
  if (local_168._M_head_impl != &local_158) {
    operator_delete(local_168._M_head_impl,
                    (ulong)((long)local_158.next_link._M_t.
                                  super___uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>
                                  .super__Head_base<0UL,_qpdf::pl::Link_*,_false>._M_head_impl + 1))
    ;
  }
  if ((char)uVar22 != '\0') {
    peVar1 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar1->qdf_mode == true) {
      ::qpdf::pl::Count::write(peVar1->pipeline,0x27db5d,(void *)0x2,(size_t)pQVar16);
    }
    ::qpdf::pl::Count::write
              (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               )->pipeline,0x27db6f,(void *)0x15,(size_t)pQVar16);
    peVar1 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar1->qdf_mode == true) {
      ::qpdf::pl::Count::write(peVar1->pipeline,0x27db5d,(void *)0x2,(size_t)pQVar16);
    }
    uVar22 = local_dc;
    cVar21 = '\x01';
    if (9 < local_dc) {
      uVar27 = local_dc;
      cVar6 = '\x04';
      do {
        cVar21 = cVar6;
        if (uVar27 < 100) {
          cVar21 = cVar21 + -2;
          goto LAB_001f5cd2;
        }
        if (uVar27 < 1000) {
          cVar21 = cVar21 + -1;
          goto LAB_001f5cd2;
        }
        if (uVar27 < 10000) goto LAB_001f5cd2;
        bVar4 = 99999 < uVar27;
        uVar27 = uVar27 / 10000;
        cVar6 = cVar21 + '\x04';
      } while (bVar4);
      cVar21 = cVar21 + '\x01';
    }
LAB_001f5cd2:
    local_128._M_head_impl = &local_118;
    std::__cxx11::string::_M_construct((ulong)&local_128,cVar21);
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)local_128._M_head_impl,(uint)local_120,uVar22);
    plVar11 = (long *)std::__cxx11::string::replace((ulong)&local_128,0,(char *)0x0,0x27dd35);
    pLVar17 = (Link *)(plVar11 + 2);
    if ((Link *)*plVar11 == pLVar17) {
      local_158.next_link._M_t.
      super___uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>._M_t.
      super__Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>.
      super__Head_base<0UL,_qpdf::pl::Link_*,_false>._M_head_impl =
           *(__uniq_ptr_data<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>,_true,_true> *)
            &(pLVar17->next_link)._M_t.
             super___uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>._M_t.
             super__Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>.
             super__Head_base<0UL,_qpdf::pl::Link_*,_false>;
      local_158.next_pl._M_t.super___uniq_ptr_impl<Pipeline,_std::default_delete<Pipeline>_>._M_t.
      super__Tuple_impl<0UL,_Pipeline_*,_std::default_delete<Pipeline>_>.
      super__Head_base<0UL,_Pipeline_*,_false>._M_head_impl =
           (__uniq_ptr_data<Pipeline,_std::default_delete<Pipeline>,_true,_true>)
           ((_Head_base<0UL,_Pipeline_*,_false> *)(plVar11 + 3))->_M_head_impl;
      local_168._M_head_impl = &local_158;
    }
    else {
      local_158.next_link._M_t.
      super___uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>._M_t.
      super__Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>.
      super__Head_base<0UL,_qpdf::pl::Link_*,_false>._M_head_impl =
           *(__uniq_ptr_data<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>,_true,_true> *)
            &(pLVar17->next_link)._M_t.
             super___uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>._M_t.
             super__Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>.
             super__Head_base<0UL,_qpdf::pl::Link_*,_false>;
      local_168._M_head_impl = (Link *)*plVar11;
    }
    local_160 = plVar11[1];
    *plVar11 = (long)pLVar17;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_168);
    pQVar16 = (QPDFWriter *)(puVar12 + 2);
    if ((QPDFWriter *)*puVar12 == pQVar16) {
      local_138.m.super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (pQVar16->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_138.m.super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar12[3];
      local_148.qw = &local_138;
    }
    else {
      local_138.m.super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (pQVar16->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_148.qw = (QPDFWriter *)*puVar12;
    }
    local_148.stack_id = puVar12[1];
    *puVar12 = pQVar16;
    puVar12[1] = 0;
    *(undefined1 *)(puVar12 + 2) = 0;
    ::qpdf::pl::Count::write
              (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               )->pipeline,(int)local_148.qw,(void *)local_148.stack_id,(size_t)pQVar16);
    if (local_148.qw != &local_138) {
      operator_delete(local_148.qw,
                      (ulong)((long)&(local_138.m.
                                      super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr)->pdf + 1));
    }
    if (local_168._M_head_impl != &local_158) {
      operator_delete(local_168._M_head_impl,
                      (ulong)((long)local_158.next_link._M_t.
                                    super___uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>
                                    .super__Head_base<0UL,_qpdf::pl::Link_*,_false>._M_head_impl + 1
                             ));
    }
    if (local_128._M_head_impl != &local_118) {
      operator_delete(local_128._M_head_impl,
                      (ulong)((long)local_118.next_link._M_t.
                                    super___uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>
                                    .super__Head_base<0UL,_qpdf::pl::Link_*,_false>._M_head_impl + 1
                             ));
    }
  }
  peVar1 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1->qdf_mode == true) {
    ::qpdf::pl::Count::write(peVar1->pipeline,0x27db5d,(void *)0x2,(size_t)pQVar16);
  }
  cVar21 = '\x01';
  if (9 < uVar20) {
    uVar19 = (ulong)uVar20;
    cVar6 = '\x04';
    do {
      cVar21 = cVar6;
      uVar22 = (uint)uVar19;
      if (uVar22 < 100) {
        cVar21 = cVar21 + -2;
        goto LAB_001f5e86;
      }
      if (uVar22 < 1000) {
        cVar21 = cVar21 + -1;
        goto LAB_001f5e86;
      }
      if (uVar22 < 10000) goto LAB_001f5e86;
      uVar19 = uVar19 / 10000;
      cVar6 = cVar21 + '\x04';
    } while (99999 < uVar22);
    cVar21 = cVar21 + '\x01';
  }
LAB_001f5e86:
  local_b0 = local_a0;
  std::__cxx11::string::_M_construct((ulong)&local_b0,cVar21);
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_b0,local_a8,uVar20);
  plVar11 = (long *)std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,0x27dd62);
  local_d8 = &local_c8;
  plVar18 = plVar11 + 2;
  if ((long *)*plVar11 == plVar18) {
    local_c8 = *plVar18;
    lStack_c0 = plVar11[3];
  }
  else {
    local_c8 = *plVar18;
    local_d8 = (long *)*plVar11;
  }
  local_d0 = plVar11[1];
  *plVar11 = (long)plVar18;
  plVar11[1] = 0;
  *(undefined1 *)(plVar11 + 2) = 0;
  plVar11 = (long *)std::__cxx11::string::append((char *)&local_d8);
  pLVar17 = (Link *)(plVar11 + 2);
  if ((Link *)*plVar11 == pLVar17) {
    local_118.next_link._M_t.
    super___uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>._M_t.
    super__Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>.
    super__Head_base<0UL,_qpdf::pl::Link_*,_false>._M_head_impl =
         *(__uniq_ptr_data<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>,_true,_true> *)
          &(pLVar17->next_link)._M_t.
           super___uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>._M_t.
           super__Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>.
           super__Head_base<0UL,_qpdf::pl::Link_*,_false>;
    local_118.next_pl._M_t.super___uniq_ptr_impl<Pipeline,_std::default_delete<Pipeline>_>._M_t.
    super__Tuple_impl<0UL,_Pipeline_*,_std::default_delete<Pipeline>_>.
    super__Head_base<0UL,_Pipeline_*,_false>._M_head_impl =
         (__uniq_ptr_data<Pipeline,_std::default_delete<Pipeline>,_true,_true>)plVar11[3];
    local_128._M_head_impl = &local_118;
  }
  else {
    local_118.next_link._M_t.
    super___uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>._M_t.
    super__Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>.
    super__Head_base<0UL,_qpdf::pl::Link_*,_false>._M_head_impl =
         *(__uniq_ptr_data<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>,_true,_true> *)
          &(pLVar17->next_link)._M_t.
           super___uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>._M_t.
           super__Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>.
           super__Head_base<0UL,_qpdf::pl::Link_*,_false>;
    local_128._M_head_impl = (Link *)*plVar11;
  }
  local_120 = plVar11[1];
  *plVar11 = (long)pLVar17;
  plVar11[1] = 0;
  *(undefined1 *)(plVar11 + 2) = 0;
  cVar21 = '\x01';
  if (9 < (uint)local_e8) {
    uVar19 = local_e8;
    cVar6 = '\x04';
    do {
      cVar21 = cVar6;
      uVar20 = (uint)uVar19;
      if (uVar20 < 100) {
        cVar21 = cVar21 + -2;
        goto LAB_001f5fd4;
      }
      if (uVar20 < 1000) {
        cVar21 = cVar21 + -1;
        goto LAB_001f5fd4;
      }
      if (uVar20 < 10000) goto LAB_001f5fd4;
      uVar19 = (uVar19 & 0xffffffff) / 10000;
      cVar6 = cVar21 + '\x04';
    } while (99999 < uVar20);
    cVar21 = cVar21 + '\x01';
  }
LAB_001f5fd4:
  local_108 = local_f8;
  std::__cxx11::string::_M_construct((ulong)&local_108,cVar21);
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_108,local_100,(uint)local_e8);
  pLVar17 = (Link *)(local_120 + CONCAT44(uStack_fc,local_100));
  uVar23._M_t.super___uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>._M_t.
  super__Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>.
  super__Head_base<0UL,_qpdf::pl::Link_*,_false>._M_head_impl =
       (__uniq_ptr_data<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>,_true,_true>)
       (__uniq_ptr_data<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>,_true,_true>)(Link *)0xf
  ;
  if (local_128._M_head_impl != &local_118) {
    uVar23._M_t.super___uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>._M_t.
    super__Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>.
    super__Head_base<0UL,_qpdf::pl::Link_*,_false>._M_head_impl =
         local_118.next_link._M_t.
         super___uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>._M_t.
         super__Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>.
         super__Head_base<0UL,_qpdf::pl::Link_*,_false>._M_head_impl;
  }
  if ((ulong)uVar23._M_t.super___uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>
             ._M_t.super__Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>.
             super__Head_base<0UL,_qpdf::pl::Link_*,_false>._M_head_impl < pLVar17) {
    pLVar24 = (Link *)0xf;
    if (local_108 != local_f8) {
      pLVar24 = local_f8[0];
    }
    if (pLVar24 < pLVar17) goto LAB_001f604c;
    plVar11 = (long *)std::__cxx11::string::replace
                                ((ulong)&local_108,0,(char *)0x0,(ulong)local_128._M_head_impl);
  }
  else {
LAB_001f604c:
    plVar11 = (long *)std::__cxx11::string::_M_append((char *)&local_128,(ulong)local_108);
  }
  pLVar17 = (Link *)(plVar11 + 2);
  if ((Link *)*plVar11 == pLVar17) {
    local_158.next_link._M_t.
    super___uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>._M_t.
    super__Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>.
    super__Head_base<0UL,_qpdf::pl::Link_*,_false>._M_head_impl =
         *(__uniq_ptr_data<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>,_true,_true> *)
          &(pLVar17->next_link)._M_t.
           super___uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>._M_t.
           super__Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>.
           super__Head_base<0UL,_qpdf::pl::Link_*,_false>;
    local_158.next_pl._M_t.super___uniq_ptr_impl<Pipeline,_std::default_delete<Pipeline>_>._M_t.
    super__Tuple_impl<0UL,_Pipeline_*,_std::default_delete<Pipeline>_>.
    super__Head_base<0UL,_Pipeline_*,_false>._M_head_impl =
         *(__uniq_ptr_data<Pipeline,_std::default_delete<Pipeline>,_true,_true> *)
          &((_Tuple_impl<0UL,_Pipeline_*,_std::default_delete<Pipeline>_> *)(plVar11 + 3))->
           super__Head_base<0UL,_Pipeline_*,_false>;
    local_168._M_head_impl = &local_158;
  }
  else {
    local_158.next_link._M_t.
    super___uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>._M_t.
    super__Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>.
    super__Head_base<0UL,_qpdf::pl::Link_*,_false>._M_head_impl =
         *(__uniq_ptr_data<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>,_true,_true> *)
          &(pLVar17->next_link)._M_t.
           super___uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>._M_t.
           super__Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>.
           super__Head_base<0UL,_qpdf::pl::Link_*,_false>;
    local_168._M_head_impl = (Link *)*plVar11;
  }
  local_160 = plVar11[1];
  *plVar11 = (long)pLVar17;
  plVar11[1] = 0;
  *(undefined1 *)
   &(pLVar17->next_link)._M_t.
    super___uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>._M_t.
    super__Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>.
    super__Head_base<0UL,_qpdf::pl::Link_*,_false> = 0;
  plVar11 = (long *)std::__cxx11::string::append((char *)&local_168);
  pQVar16 = (QPDFWriter *)(plVar11 + 2);
  if ((QPDFWriter *)*plVar11 == pQVar16) {
    local_138.m.super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (pQVar16->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_138.m.super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar11[3];
    local_148.qw = &local_138;
  }
  else {
    local_138.m.super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (pQVar16->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_148.qw = (QPDFWriter *)*plVar11;
  }
  local_148.stack_id = plVar11[1];
  *plVar11 = (long)pQVar16;
  plVar11[1] = 0;
  *(undefined1 *)(plVar11 + 2) = 0;
  ::qpdf::pl::Count::write
            (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
             ->pipeline,(int)local_148.qw,(void *)local_148.stack_id,(size_t)pQVar16);
  if (local_148.qw != &local_138) {
    operator_delete(local_148.qw,
                    (ulong)((long)&(local_138.m.
                                    super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->pdf + 1));
  }
  if (local_168._M_head_impl != &local_158) {
    operator_delete(local_168._M_head_impl,
                    (ulong)((long)local_158.next_link._M_t.
                                  super___uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>
                                  .super__Head_base<0UL,_qpdf::pl::Link_*,_false>._M_head_impl + 1))
    ;
  }
  if (local_108 != local_f8) {
    operator_delete(local_108,
                    (ulong)((long)&(local_f8[0]->next_link)._M_t.
                                   super___uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>
                                   .super__Head_base<0UL,_qpdf::pl::Link_*,_false> + 1));
  }
  if (local_128._M_head_impl != &local_118) {
    operator_delete(local_128._M_head_impl,
                    (ulong)((long)local_118.next_link._M_t.
                                  super___uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>
                                  .super__Head_base<0UL,_qpdf::pl::Link_*,_false>._M_head_impl + 1))
    ;
  }
  if (local_d8 != &local_c8) {
    operator_delete(local_d8,local_c8 + 1);
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0,local_a0[0] + 1);
  }
  uVar20 = (uint)local_b8;
  if (size + -1 == last && uVar20 == 0) goto LAB_001f65c4;
  uVar22 = -uVar20;
  if (0 < (int)uVar20) {
    uVar22 = uVar20;
  }
  uVar20 = 1;
  if (9 < uVar22) {
    uVar19 = (ulong)uVar22;
    uVar27 = 4;
    do {
      uVar20 = uVar27;
      uVar13 = (uint)uVar19;
      if (uVar13 < 100) {
        uVar20 = uVar20 - 2;
        goto LAB_001f6242;
      }
      if (uVar13 < 1000) {
        uVar20 = uVar20 - 1;
        goto LAB_001f6242;
      }
      if (uVar13 < 10000) goto LAB_001f6242;
      uVar19 = uVar19 / 10000;
      uVar27 = uVar20 + 4;
    } while (99999 < uVar13);
    uVar20 = uVar20 + 1;
  }
LAB_001f6242:
  uVar19 = local_b8 >> 0x1f;
  local_b0 = local_a0;
  std::__cxx11::string::_M_construct
            ((ulong)&local_b0,(char)uVar20 - ((char)(local_b8 >> 0x18) >> 7));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((long)local_b0 + (uVar19 & 1)),uVar20,uVar22);
  plVar11 = (long *)std::__cxx11::string::replace((ulong)&local_b0,0,(char *)0x0,0x27dd6b);
  uVar19 = local_78;
  local_d8 = &local_c8;
  plVar18 = plVar11 + 2;
  if ((long *)*plVar11 == plVar18) {
    local_c8 = *plVar18;
    lStack_c0 = plVar11[3];
  }
  else {
    local_c8 = *plVar18;
    local_d8 = (long *)*plVar11;
  }
  local_d0 = plVar11[1];
  *plVar11 = (long)plVar18;
  plVar11[1] = 0;
  *(undefined1 *)(plVar11 + 2) = 0;
  plVar11 = (long *)std::__cxx11::string::append((char *)&local_d8);
  pLVar17 = (Link *)(plVar11 + 2);
  if ((Link *)*plVar11 == pLVar17) {
    local_118.next_link._M_t.
    super___uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>._M_t.
    super__Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>.
    super__Head_base<0UL,_qpdf::pl::Link_*,_false>._M_head_impl =
         *(__uniq_ptr_data<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>,_true,_true> *)
          &(pLVar17->next_link)._M_t.
           super___uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>._M_t.
           super__Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>.
           super__Head_base<0UL,_qpdf::pl::Link_*,_false>;
    local_118.next_pl._M_t.super___uniq_ptr_impl<Pipeline,_std::default_delete<Pipeline>_>._M_t.
    super__Tuple_impl<0UL,_Pipeline_*,_std::default_delete<Pipeline>_>.
    super__Head_base<0UL,_Pipeline_*,_false>._M_head_impl =
         (__uniq_ptr_data<Pipeline,_std::default_delete<Pipeline>,_true,_true>)plVar11[3];
    local_128._M_head_impl = &local_118;
  }
  else {
    local_118.next_link._M_t.
    super___uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>._M_t.
    super__Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>.
    super__Head_base<0UL,_qpdf::pl::Link_*,_false>._M_head_impl =
         *(__uniq_ptr_data<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>,_true,_true> *)
          &(pLVar17->next_link)._M_t.
           super___uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>._M_t.
           super__Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>.
           super__Head_base<0UL,_qpdf::pl::Link_*,_false>;
    local_128._M_head_impl = (Link *)*plVar11;
  }
  local_120 = plVar11[1];
  *plVar11 = (long)pLVar17;
  plVar11[1] = 0;
  *(undefined1 *)(plVar11 + 2) = 0;
  uVar22 = (int)uVar19 + 1;
  uVar20 = -uVar22;
  if (0 < (int)uVar22) {
    uVar20 = uVar22;
  }
  uVar27 = 1;
  if (9 < uVar20) {
    uVar19 = (ulong)uVar20;
    uVar13 = 4;
    do {
      uVar27 = uVar13;
      uVar14 = (uint)uVar19;
      if (uVar14 < 100) {
        uVar27 = uVar27 - 2;
        goto LAB_001f63b3;
      }
      if (uVar14 < 1000) {
        uVar27 = uVar27 - 1;
        goto LAB_001f63b3;
      }
      if (uVar14 < 10000) goto LAB_001f63b3;
      uVar19 = uVar19 / 10000;
      uVar13 = uVar27 + 4;
    } while (99999 < uVar14);
    uVar27 = uVar27 + 1;
  }
LAB_001f63b3:
  local_108 = local_f8;
  std::__cxx11::string::_M_construct((ulong)&local_108,(char)uVar27 - (char)((int)uVar22 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((long)local_108 + (ulong)(uVar22 >> 0x1f)),uVar27,uVar20);
  pLVar17 = (Link *)(local_120 + CONCAT44(uStack_fc,local_100));
  uVar23._M_t.super___uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>._M_t.
  super__Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>.
  super__Head_base<0UL,_qpdf::pl::Link_*,_false>._M_head_impl =
       (__uniq_ptr_data<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>,_true,_true>)
       (__uniq_ptr_data<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>,_true,_true>)(Link *)0xf
  ;
  if (local_128._M_head_impl != &local_118) {
    uVar23._M_t.super___uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>._M_t.
    super__Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>.
    super__Head_base<0UL,_qpdf::pl::Link_*,_false>._M_head_impl =
         local_118.next_link._M_t.
         super___uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>._M_t.
         super__Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>.
         super__Head_base<0UL,_qpdf::pl::Link_*,_false>._M_head_impl;
  }
  if ((ulong)uVar23._M_t.super___uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>
             ._M_t.super__Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>.
             super__Head_base<0UL,_qpdf::pl::Link_*,_false>._M_head_impl < pLVar17) {
    pLVar24 = (Link *)0xf;
    if (local_108 != local_f8) {
      pLVar24 = local_f8[0];
    }
    if (pLVar24 < pLVar17) goto LAB_001f6444;
    plVar11 = (long *)std::__cxx11::string::replace
                                ((ulong)&local_108,0,(char *)0x0,(ulong)local_128._M_head_impl);
  }
  else {
LAB_001f6444:
    plVar11 = (long *)std::__cxx11::string::_M_append((char *)&local_128,(ulong)local_108);
  }
  local_168._M_head_impl = &local_158;
  pLVar17 = (Link *)(plVar11 + 2);
  if ((Link *)*plVar11 == pLVar17) {
    local_158.next_link._M_t.
    super___uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>._M_t.
    super__Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>.
    super__Head_base<0UL,_qpdf::pl::Link_*,_false>._M_head_impl =
         *(__uniq_ptr_data<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>,_true,_true> *)
          &(pLVar17->next_link)._M_t.
           super___uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>._M_t.
           super__Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>.
           super__Head_base<0UL,_qpdf::pl::Link_*,_false>;
    local_158.next_pl._M_t.super___uniq_ptr_impl<Pipeline,_std::default_delete<Pipeline>_>._M_t.
    super__Tuple_impl<0UL,_Pipeline_*,_std::default_delete<Pipeline>_>.
    super__Head_base<0UL,_Pipeline_*,_false>._M_head_impl =
         *(__uniq_ptr_data<Pipeline,_std::default_delete<Pipeline>,_true,_true> *)
          &((_Tuple_impl<0UL,_Pipeline_*,_std::default_delete<Pipeline>_> *)(plVar11 + 3))->
           super__Head_base<0UL,_Pipeline_*,_false>;
  }
  else {
    local_158.next_link._M_t.
    super___uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>._M_t.
    super__Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>.
    super__Head_base<0UL,_qpdf::pl::Link_*,_false>._M_head_impl =
         *(__uniq_ptr_data<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>,_true,_true> *)
          &(pLVar17->next_link)._M_t.
           super___uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>._M_t.
           super__Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>.
           super__Head_base<0UL,_qpdf::pl::Link_*,_false>;
    local_168._M_head_impl = (Link *)*plVar11;
  }
  local_160 = plVar11[1];
  *plVar11 = (long)pLVar17;
  plVar11[1] = 0;
  *(undefined1 *)
   &(pLVar17->next_link)._M_t.
    super___uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>._M_t.
    super__Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>.
    super__Head_base<0UL,_qpdf::pl::Link_*,_false> = 0;
  plVar11 = (long *)std::__cxx11::string::append((char *)&local_168);
  pQVar16 = (QPDFWriter *)(plVar11 + 2);
  if ((QPDFWriter *)*plVar11 == pQVar16) {
    local_138.m.super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (pQVar16->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_138.m.super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar11[3];
    local_148.qw = &local_138;
  }
  else {
    local_138.m.super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (pQVar16->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_148.qw = (QPDFWriter *)*plVar11;
  }
  local_148.stack_id = plVar11[1];
  *plVar11 = (long)pQVar16;
  plVar11[1] = 0;
  *(undefined1 *)(plVar11 + 2) = 0;
  ::qpdf::pl::Count::write
            (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
             ->pipeline,(int)local_148.qw,(void *)local_148.stack_id,(size_t)pQVar16);
  if (local_148.qw != &local_138) {
    operator_delete(local_148.qw,
                    (ulong)((long)&(local_138.m.
                                    super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->pdf + 1));
  }
  if (local_168._M_head_impl != &local_158) {
    operator_delete(local_168._M_head_impl,
                    (ulong)((long)local_158.next_link._M_t.
                                  super___uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>
                                  .super__Head_base<0UL,_qpdf::pl::Link_*,_false>._M_head_impl + 1))
    ;
  }
  if (local_108 != local_f8) {
    operator_delete(local_108,
                    (ulong)((long)&(local_f8[0]->next_link)._M_t.
                                   super___uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>
                                   .super__Head_base<0UL,_qpdf::pl::Link_*,_false> + 1));
  }
  if (local_128._M_head_impl != &local_118) {
    operator_delete(local_128._M_head_impl,
                    (ulong)((long)local_118.next_link._M_t.
                                  super___uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>
                                  .super__Head_base<0UL,_qpdf::pl::Link_*,_false>._M_head_impl + 1))
    ;
  }
  if (local_d8 != &local_c8) {
    operator_delete(local_d8,local_c8 + 1);
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0,local_a0[0] + 1);
  }
LAB_001f65c4:
  __n = 1;
  writeTrailer(this,local_84,size,true,prev,linearization_pass);
  ::qpdf::pl::Count::write
            (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
             ->pipeline,0x27dcde,(void *)0x8,__n);
  ::qpdf::pl::Count::write
            (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
             ->pipeline,(int)local_60._M_dataplus._M_p,(void *)local_60._M_string_length,__n);
  ::qpdf::pl::Count::write
            (((this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
             ->pipeline,0x27dd76,(void *)0xa,__n);
  closeObject(this,iVar25);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,
                    CONCAT71(local_60.field_2._M_allocated_capacity._1_7_,
                             local_60.field_2._M_local_buf[0]) + 1);
  }
  return local_40 - 1;
}

Assistant:

qpdf_offset_t
QPDFWriter::writeXRefStream(
    int xref_id,
    int max_id,
    qpdf_offset_t max_offset,
    trailer_e which,
    int first,
    int last,
    int size,
    qpdf_offset_t prev,
    int hint_id,
    qpdf_offset_t hint_offset,
    qpdf_offset_t hint_length,
    bool skip_compression,
    int linearization_pass)
{
    qpdf_offset_t xref_offset = m->pipeline->getCount();
    qpdf_offset_t space_before_zero = xref_offset - 1;

    // field 1 contains offsets and object stream identifiers
    unsigned int f1_size = std::max(bytesNeeded(max_offset + hint_length), bytesNeeded(max_id));

    // field 2 contains object stream indices
    unsigned int f2_size = bytesNeeded(QIntC::to_longlong(m->max_ostream_index));

    unsigned int esize = 1 + f1_size + f2_size;

    // Must store in xref table in advance of writing the actual data rather than waiting for
    // openObject to do it.
    m->new_obj[xref_id].xref = QPDFXRefEntry(m->pipeline->getCount());

    std::string xref_data;
    const bool compressed = m->compress_streams && !m->qdf_mode;
    {
        PipelinePopper pp_xref(this);
        if (compressed) {
            m->count_buffer.clear();
            auto link = pl::create<pl::String>(xref_data);
            if (!skip_compression) {
                // Write the stream dictionary for compression but don't actually compress.  This
                // helps us with computation of padding for pass 1 of linearization.
                link = pl::create<Pl_Flate>(std::move(link), Pl_Flate::a_deflate);
            }
            activatePipelineStack(
                pp_xref, pl::create<Pl_PNGFilter>(std::move(link), Pl_PNGFilter::a_encode, esize));
        } else {
            activatePipelineStack(pp_xref, xref_data);
        }

        for (int i = first; i <= last; ++i) {
            QPDFXRefEntry& e = m->new_obj[i].xref;
            switch (e.getType()) {
            case 0:
                writeBinary(0, 1);
                writeBinary(0, f1_size);
                writeBinary(0, f2_size);
                break;

            case 1:
                {
                    qpdf_offset_t offset = e.getOffset();
                    if ((hint_id != 0) && (i != hint_id) && (offset >= hint_offset)) {
                        offset += hint_length;
                    }
                    writeBinary(1, 1);
                    writeBinary(QIntC::to_ulonglong(offset), f1_size);
                    writeBinary(0, f2_size);
                }
                break;

            case 2:
                writeBinary(2, 1);
                writeBinary(QIntC::to_ulonglong(e.getObjStreamNumber()), f1_size);
                writeBinary(QIntC::to_ulonglong(e.getObjStreamIndex()), f2_size);
                break;

            default:
                throw std::logic_error("invalid type writing xref stream");
                break;
            }
        }
    }

    openObject(xref_id);
    writeString("<<");
    writeStringQDF("\n ");
    writeString(" /Type /XRef");
    writeStringQDF("\n ");
    writeString(" /Length " + std::to_string(xref_data.size()));
    if (compressed) {
        writeStringQDF("\n ");
        writeString(" /Filter /FlateDecode");
        writeStringQDF("\n ");
        writeString(" /DecodeParms << /Columns " + std::to_string(esize) + " /Predictor 12 >>");
    }
    writeStringQDF("\n ");
    writeString(" /W [ 1 " + std::to_string(f1_size) + " " + std::to_string(f2_size) + " ]");
    if (!((first == 0) && (last == size - 1))) {
        writeString(
            " /Index [ " + std::to_string(first) + " " + std::to_string(last - first + 1) + " ]");
    }
    writeTrailer(which, size, true, prev, linearization_pass);
    writeString("\nstream\n");
    writeString(xref_data);
    writeString("\nendstream");
    closeObject(xref_id);
    return space_before_zero;
}